

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O1

void __thiscall
Output::compute_solvation_energy
          (Output *this,InterpolationPoints *elem_interp_pts,Tree *elem_tree,
          InterpolationPoints *mol_interp_pts,Tree *mol_tree,InteractionList *interaction_list)

{
  Timers_Output *pTVar1;
  rep rVar2;
  long lVar3;
  double dVar4;
  SolvationEnergyCompute solvation_energy;
  
  pTVar1 = this->timers_;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (pTVar1->compute_solvation_energy).start_time_.__d.__r = rVar2;
  SolvationEnergyCompute::SolvationEnergyCompute
            (&solvation_energy,&this->potential_,this->elements_,elem_interp_pts,elem_tree,
             this->molecule_,mol_interp_pts,mol_tree,interaction_list,this->params_->phys_eps_,
             this->params_->phys_kappa_);
  dVar4 = SolvationEnergyCompute::compute(&solvation_energy);
  this->solvation_energy_ = dVar4;
  pTVar1 = this->timers_;
  lVar3 = std::chrono::_V2::steady_clock::now();
  (pTVar1->compute_solvation_energy).end_time_.__d.__r = lVar3;
  (pTVar1->compute_solvation_energy).elapsed_time_.__r =
       (double)(lVar3 - (pTVar1->compute_solvation_energy).start_time_.__d.__r) / 1000000.0 +
       (pTVar1->compute_solvation_energy).elapsed_time_.__r;
  SolvationEnergyCompute::~SolvationEnergyCompute(&solvation_energy);
  return;
}

Assistant:

void Output::compute_solvation_energy(const class InterpolationPoints& elem_interp_pts, const class Tree& elem_tree,
                                      const class InterpolationPoints& mol_interp_pts,  const class Tree& mol_tree,
                                      const class InteractionList& interaction_list)
{
    timers_.compute_solvation_energy.start();
    const double* __restrict potential_ptr = potential_.data();
    std::size_t potential_num = potential_.size();
    
#ifdef OPENACC_ENABLED
    #pragma acc enter data copyin(potential_ptr[0:potential_num])
#endif
    
    class SolvationEnergyCompute solvation_energy(potential_,
                                                  elements_, elem_interp_pts, elem_tree,
                                                  molecule_, mol_interp_pts, mol_tree,
                                                  interaction_list, params_.phys_eps_, params_.phys_kappa_);
                                                  
    solvation_energy_ = solvation_energy.compute();
    
#ifdef OPENACC_ENABLED
    #pragma acc exit data delete(potential_ptr[0:potential_num])
#endif

    timers_.compute_solvation_energy.stop();
}